

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ADC_AB(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t address;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  
  this->cycles = 4;
  bVar5 = this->A;
  address = GetWord(this);
  bVar1 = ReadByte(this,address);
  uVar3 = ((this->field_6).ps & 1) + (uint)this->A + (uint)bVar1;
  bVar2 = (byte)uVar3;
  this->A = bVar2;
  uVar4 = bVar5 & 0xffffff80;
  bVar5 = ((bVar2 & 0x80) != (byte)uVar4) << 6;
  if ((bVar1 & 0xffffff80) != uVar4) {
    bVar5 = 0;
  }
  (this->field_6).ps =
       (bVar2 == 0) * '\x02' | (this->field_6).ps & 0x3c | 0xff < uVar3 | bVar5 | bVar2 & 0x80;
  return;
}

Assistant:

void CPU::ADC_AB()
{
    cycles = 4;
    uint8_t acp = A, op = ReadByte(GetWord());
    uint16_t sum = A + op + C;
    A = (sum & 0xFF);
    C = (sum & 0xFF00) > 0;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}